

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O1

void __thiscall Rml::ElementEffects::RenderEffects(ElementEffects *this,RenderStage render_stage)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pFVar3;
  element_type *peVar4;
  long *plVar5;
  code *pcVar6;
  Vector2Type VVar7;
  Vector2Type VVar8;
  undefined1 auVar9 [8];
  bool bVar10;
  RenderManager *this_00;
  LayerHandle LVar11;
  LayerHandle destination;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  FilterEntry *filter;
  pointer pFVar16;
  Span<const_unsigned_long> filters;
  Span<const_unsigned_long> filters_00;
  Rectanglei RVar17;
  Rectangle<int> RVar18;
  FilterHandleList filter_handles;
  Rectanglef filter_region;
  undefined1 local_98 [8];
  Vector2Type VStack_90;
  pointer local_88;
  Rectanglef local_78;
  Rectanglei local_60;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  pointer local_40;
  pointer local_38;
  
  InstanceEffects(this);
  ReloadEffectsData(this);
  pDVar1 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((render_stage == Decoration && pDVar1 != pDVar2) &&
     (uVar12 = (uint)((ulong)((long)pDVar2 - (long)pDVar1) >> 5), 0 < (int)uVar12)) {
    uVar13 = (ulong)(uVar12 & 0x7fffffff);
    lVar15 = uVar13 + 1;
    lVar14 = uVar13 * 0x20 + -0x10;
    do {
      pDVar1 = (this->decorators).
               super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pDVar1->decorator).
                           super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + lVar14) != 0) {
        (**(code **)(**(long **)((long)pDVar1 + lVar14 + -0x10) + 0x20))();
      }
      lVar15 = lVar15 + -1;
      lVar14 = lVar14 + -0x20;
    } while (1 < lVar15);
  }
  if (((((this->filters).
         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->filters).
         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->backdrop_filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->backdrop_filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) ||
      ((this->mask_images).
       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->mask_images).
       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (this_00 = Element::GetRenderManager(this->element), this_00 != (RenderManager *)0x0)) {
    local_60 = RenderManager::GetScissorRegion(this_00);
    if (render_stage == Exit) {
      if (((this->filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((this->mask_images).
          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->mask_images).
          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        ElementUtilities::SetClippingRegion(this->element,false);
        local_98._0_4_ = 0.0;
        local_98._4_4_ = 0.0;
        VStack_90.x = -1.0;
        VStack_90.y = -1.0;
        ElementUtilities::GetBoundingBox((Rectanglef *)local_98,this->element,Auto);
        pFVar3 = (this->filters).
                 super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar16 = (this->filters).
                       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar16 != pFVar3;
            pFVar16 = pFVar16 + 1) {
          peVar4 = (pFVar16->filter).
                   super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar4->_vptr_Filter[3])(peVar4,this->element,local_98);
        }
        Math::ExpandToPixelGrid((Rectanglef *)local_98);
        local_78.p0.x = (float)(int)(float)local_98._0_4_;
        local_78.p0.y = (float)(int)(float)local_98._4_4_;
        local_78.p1.x = (float)(int)VStack_90.x;
        local_78.p1.y = (float)(int)VStack_90.y;
        RVar17 = RenderManager::GetScissorRegion(this_00);
        RVar18 = Rectangle<int>::IntersectIfValid((Rectangle<int> *)&local_78,RVar17);
        RenderManager::SetScissorRegion(this_00,RVar18);
        local_78.p0.x = 0.0;
        local_78.p0.y = 0.0;
        local_78.p1.x = 0.0;
        local_78.p1.y = 0.0;
        local_98._0_4_ = 0.0;
        local_98._4_4_ = 0.0;
        VStack_90.x = 0.0;
        VStack_90.y = 0.0;
        local_88 = (pointer)0x0;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,
                   (ulong)((this->mask_images).
                           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start !=
                          (this->mask_images).
                          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish) +
                   ((long)(this->filters).
                          super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->filters).
                          super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        pFVar3 = (this->filters).
                 super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar16 = (this->filters).
                       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar16 != pFVar3;
            pFVar16 = pFVar16 + 1) {
          CompiledFilter::AddHandleTo(&pFVar16->compiled,(FilterHandleList *)local_98);
        }
        if ((this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->mask_images).
            super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          RenderManager::PushLayer(this_00);
          uVar12 = (uint)((ulong)((long)(this->mask_images).
                                        super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->mask_images).
                                       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar12) {
            uVar13 = (ulong)(uVar12 & 0x7fffffff);
            lVar15 = uVar13 + 1;
            lVar14 = uVar13 * 0x20 + -0x10;
            do {
              pDVar1 = (this->mask_images).
                       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pDVar1->decorator).
                                   super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar14) != 0) {
                plVar5 = *(long **)((long)pDVar1 + lVar14 + -0x10);
                (**(code **)(*plVar5 + 0x20))(plVar5,this->element);
              }
              lVar15 = lVar15 + -1;
              lVar14 = lVar14 + -0x20;
            } while (1 < lVar15);
          }
          RenderManager::SaveLayerAsMaskImage((RenderManager *)&stack0xffffffffffffffb0);
          CompiledFilter::Release((CompiledFilter *)&local_78);
          local_78.p1 = _fStack_48;
          local_78.p0 = _local_50;
          local_50 = 0.0;
          fStack_4c = 0.0;
          fStack_48 = 0.0;
          fStack_44 = 0.0;
          CompiledFilter::Release((CompiledFilter *)&stack0xffffffffffffffb0);
          CompiledFilter::AddHandleTo((CompiledFilter *)&local_78,(FilterHandleList *)local_98);
          RenderManager::PopLayer(this_00);
        }
        LVar11 = RenderManager::GetTopLayer(this_00);
        destination = RenderManager::GetNextLayer(this_00);
        VVar7 = VStack_90;
        auVar9 = local_98;
        if ((VStack_90 != (Vector2Type)0x0 && (Vector2Type)local_98 == (Vector2Type)0x0) &&
           (bVar10 = Assert("RMLUI_ASSERT(data != nullptr || size == 0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Span.h"
                            ,0x2f), !bVar10)) {
LAB_0022a5e3:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        filters_00.m_size = (long)VVar7 - (long)auVar9 >> 3;
        filters_00.m_data = (unsigned_long *)auVar9;
        RenderManager::CompositeLayers(this_00,LVar11,destination,Blend,filters_00);
        RenderManager::PopLayer(this_00);
        RenderManager::SetScissorRegion(this_00,local_60);
        if ((Vector2Type)local_98 != (Vector2Type)0x0) {
          operator_delete((void *)local_98,(long)local_88 - (long)local_98);
        }
        CompiledFilter::Release((CompiledFilter *)&local_78);
      }
    }
    else if (render_stage == Enter) {
      local_38 = (pointer)RenderManager::GetTopLayer(this_00);
      if (((this->filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((this->mask_images).
          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->mask_images).
          super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        RenderManager::PushLayer(this_00);
      }
      if ((this->backdrop_filters).
          super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->backdrop_filters).
          super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_40 = (pointer)RenderManager::GetTopLayer(this_00);
        local_98._0_4_ = 0.0;
        local_98._4_4_ = 0.0;
        VStack_90.x = -1.0;
        VStack_90.y = -1.0;
        ElementUtilities::GetBoundingBox((Rectanglef *)local_98,this->element,Border);
        pFVar3 = (this->backdrop_filters).
                 super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar16 = (this->backdrop_filters).
                       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar16 != pFVar3;
            pFVar16 = pFVar16 + 1) {
          peVar4 = (pFVar16->filter).
                   super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar4->_vptr_Filter[3])(peVar4,this->element,local_98);
        }
        Math::ExpandToPixelGrid((Rectanglef *)local_98);
        RVar17.p0.x = (int)(float)local_98._0_4_;
        RVar17.p1.x = (int)VStack_90.x;
        RVar17.p0.y = (int)(float)local_98._4_4_;
        RVar17.p1.y = (int)VStack_90.y;
        RenderManager::SetScissorRegion(this_00,RVar17);
        RenderManager::PushLayer(this_00);
        LVar11 = RenderManager::GetTopLayer(this_00);
        local_98._0_4_ = 0.0;
        local_98._4_4_ = 0.0;
        VStack_90.x = 0.0;
        VStack_90.y = 0.0;
        local_88 = (pointer)0x0;
        pFVar3 = (this->backdrop_filters).
                 super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        VVar7 = (Vector2Type)local_98;
        VVar8 = VStack_90;
        for (pFVar16 = (this->backdrop_filters).
                       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; local_98 = (undefined1  [8])VVar7,
            VStack_90 = VVar8, pFVar16 != pFVar3; pFVar16 = pFVar16 + 1) {
          CompiledFilter::AddHandleTo(&pFVar16->compiled,(FilterHandleList *)local_98);
          VVar7 = (Vector2Type)local_98;
          VVar8 = VStack_90;
        }
        if ((VVar8 != (Vector2Type)0x0 && VVar7 == (Vector2Type)0x0) &&
           (bVar10 = Assert("RMLUI_ASSERT(data != nullptr || size == 0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Span.h"
                            ,0x2f), !bVar10)) goto LAB_0022a5e3;
        filters.m_size = (long)VVar8 - (long)VVar7 >> 3;
        filters.m_data = (unsigned_long *)VVar7;
        RenderManager::CompositeLayers(this_00,(LayerHandle)local_38,LVar11,Blend,filters);
        ElementUtilities::SetClippingRegion(this->element,true);
        local_78.p0.x = 0.0;
        local_78.p0.y = 0.0;
        local_78.p1.x = -1.0;
        local_78.p1.y = -1.0;
        ElementUtilities::GetBoundingBox(&local_78,this->element,Border);
        Math::ExpandToPixelGrid(&local_78);
        local_50 = (float)(int)local_78.p0.x;
        fStack_48 = (float)(int)local_78.p1.x;
        fStack_4c = (float)(int)local_78.p0.y;
        fStack_44 = (float)(int)local_78.p1.y;
        RVar17 = RenderManager::GetScissorRegion(this_00);
        RVar18 = Rectangle<int>::IntersectIfValid((Rectangle<int> *)&stack0xffffffffffffffb0,RVar17)
        ;
        RenderManager::SetScissorRegion(this_00,RVar18);
        RenderManager::CompositeLayers
                  (this_00,LVar11,(LayerHandle)local_40,Blend,(Span<const_unsigned_long>)ZEXT816(0))
        ;
        RenderManager::PopLayer(this_00);
        RenderManager::SetScissorRegion(this_00,local_60);
        if ((Vector2Type)local_98 != (Vector2Type)0x0) {
          operator_delete((void *)local_98,(long)local_88 - (long)local_98);
        }
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::RenderEffects(RenderStage render_stage)
{
	InstanceEffects();
	ReloadEffectsData();

	if (!decorators.empty())
	{
		if (render_stage == RenderStage::Decoration)
		{
			// Render the decorators attached to this element in its current state.
			// Render from back to front for correct render order.
			for (int i = (int)decorators.size() - 1; i >= 0; i--)
			{
				DecoratorEntry& decorator = decorators[i];
				if (decorator.decorator_data)
					decorator.decorator->RenderElement(element, decorator.decorator_data);
			}
		}
	}

	if (filters.empty() && backdrop_filters.empty() && mask_images.empty())
		return;

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	Rectanglei initial_scissor_region = render_manager->GetScissorRegion();

	auto ApplyClippingRegion = [this, &render_manager](PropertyId filter_id) {
		RMLUI_ASSERT(filter_id == PropertyId::Filter || filter_id == PropertyId::BackdropFilter);

		const bool force_clip_to_self_border_box = (filter_id == PropertyId::BackdropFilter);
		ElementUtilities::SetClippingRegion(element, force_clip_to_self_border_box);

		// Find the region being affected by the active filters and apply it as a scissor.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, force_clip_to_self_border_box ? BoxArea::Border : BoxArea::Auto);

		// The filter property may draw outside our normal clipping region due to ink overflow.
		if (filter_id == PropertyId::Filter)
		{
			for (const auto& filter : filters)
				filter.filter->ExtendInkOverflow(element, filter_region);
		}

		Math::ExpandToPixelGrid(filter_region);

		Rectanglei scissor_region = Rectanglei(filter_region).IntersectIfValid(render_manager->GetScissorRegion());
		render_manager->SetScissorRegion(scissor_region);
	};
	auto ApplyScissorRegionForBackdrop = [this, &render_manager]() {
		// Set the scissor region for backdrop drawing, which covers the element's border box plus any area we may need
		// to read from, such as any blur radius.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, BoxArea::Border);
		for (const auto& filter : backdrop_filters)
			filter.filter->ExtendInkOverflow(element, filter_region);
		Math::ExpandToPixelGrid(filter_region);
		render_manager->SetScissorRegion(Rectanglei(filter_region));
	};

	if (render_stage == RenderStage::Enter)
	{
		const LayerHandle backdrop_source_layer = render_manager->GetTopLayer();

		if (!filters.empty() || !mask_images.empty())
		{
			render_manager->PushLayer();
		}

		if (!backdrop_filters.empty())
		{
			const LayerHandle backdrop_destination_layer = render_manager->GetTopLayer();

			// @performance We strictly only need this temporary buffer when having to read from outside the element
			// boundaries, which currently only applies to blur and drop-shadow. Alternatively, we could avoid this
			// completely if we introduced a render interface API concept of different input and output clipping. That
			// is, we set a large input scissor to cover all input data, which can be used e.g. during blurring, and use
			// our small border-area-only clipping region for the composite layers output.
			ApplyScissorRegionForBackdrop();
			render_manager->PushLayer();
			const LayerHandle backdrop_temp_layer = render_manager->GetTopLayer();

			FilterHandleList filter_handles;
			for (auto& filter : backdrop_filters)
				filter.compiled.AddHandleTo(filter_handles);

			// Render the backdrop filters in the extended scissor region including any ink overflow.
			render_manager->CompositeLayers(backdrop_source_layer, backdrop_temp_layer, BlendMode::Blend, filter_handles);

			// Then composite the filter output to our destination while applying our clipping region, including any border-radius.
			ApplyClippingRegion(PropertyId::BackdropFilter);
			render_manager->CompositeLayers(backdrop_temp_layer, backdrop_destination_layer, BlendMode::Blend, {});
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
	else if (render_stage == RenderStage::Exit)
	{
		if (!filters.empty() || !mask_images.empty())
		{
			ApplyClippingRegion(PropertyId::Filter);

			CompiledFilter mask_image_filter;
			FilterHandleList filter_handles;
			filter_handles.reserve(filters.size() + (mask_images.empty() ? 0 : 1));

			for (auto& filter : filters)
				filter.compiled.AddHandleTo(filter_handles);

			if (!mask_images.empty())
			{
				render_manager->PushLayer();

				for (int i = (int)mask_images.size() - 1; i >= 0; i--)
				{
					DecoratorEntry& mask_image = mask_images[i];
					if (mask_image.decorator_data)
						mask_image.decorator->RenderElement(element, mask_image.decorator_data);
				}
				mask_image_filter = render_manager->SaveLayerAsMaskImage();
				mask_image_filter.AddHandleTo(filter_handles);
				render_manager->PopLayer();
			}

			render_manager->CompositeLayers(render_manager->GetTopLayer(), render_manager->GetNextLayer(), BlendMode::Blend, filter_handles);
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
}